

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aec_core.cc
# Opt level: O2

void webrtc::FilterAdaptation
               (int num_partitions,int x_fft_buf_block_pos,float (*x_fft_buf) [2080],
               float (*e_fft) [65],float (*h_fft_buf) [2080])

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  float *pfVar4;
  ulong uVar5;
  int iVar6;
  float fft [128];
  float local_238 [64];
  undefined1 local_138 [264];
  
  uVar2 = 0;
  if (0 < num_partitions) {
    uVar2 = (ulong)(uint)num_partitions;
  }
  iVar6 = x_fft_buf_block_pos * 0x41;
  pfVar4 = h_fft_buf[1] + 1;
  for (uVar5 = 0; uVar5 != uVar2; uVar5 = uVar5 + 1) {
    iVar1 = num_partitions * -0x41;
    if ((long)((long)x_fft_buf_block_pos + uVar5) < (long)num_partitions) {
      iVar1 = 0;
    }
    for (lVar3 = 0; lVar3 != 0x40; lVar3 = lVar3 + 1) {
      *(ulong *)(local_238 + lVar3 * 2) =
           CONCAT44(e_fft[1][lVar3] * (*x_fft_buf)[(iVar1 + iVar6) + lVar3] +
                    -x_fft_buf[1][(iVar1 + iVar6) + lVar3] * (*e_fft)[lVar3],
                    (*e_fft)[lVar3] * (*x_fft_buf)[(iVar1 + iVar6) + lVar3] +
                    x_fft_buf[1][(iVar1 + iVar6) + lVar3] * e_fft[1][lVar3]);
    }
    lVar3 = (long)((int)((long)x_fft_buf_block_pos + uVar5) * 0x41 + iVar1);
    local_238[1] = (*x_fft_buf)[lVar3 + 0x40] * (*e_fft)[0x40] +
                   x_fft_buf[1][lVar3 + 0x40] * e_fft[1][0x40];
    aec_rdft_inverse_128(local_238);
    memset(local_138,0,0x100);
    for (lVar3 = 0; lVar3 != 0x40; lVar3 = lVar3 + 1) {
      local_238[lVar3] = local_238[lVar3] * 0.015625;
    }
    aec_rdft_forward_128(local_238);
    (*h_fft_buf)[uVar5 * 0x41] = local_238[0] + (*h_fft_buf)[uVar5 * 0x41];
    (*h_fft_buf)[uVar5 * 0x41 + 0x40] = local_238[1] + (*h_fft_buf)[uVar5 * 0x41 + 0x40];
    for (lVar3 = 0; lVar3 != 0x3f; lVar3 = lVar3 + 1) {
      pfVar4[lVar3 + -0x820] = local_238[lVar3 * 2 + 2] + pfVar4[lVar3 + -0x820];
      pfVar4[lVar3] = local_238[lVar3 * 2 + 3] + pfVar4[lVar3];
    }
    iVar6 = iVar6 + 0x41;
    pfVar4 = pfVar4 + 0x41;
  }
  return;
}

Assistant:

static void FilterAdaptation(
    int num_partitions,
    int x_fft_buf_block_pos,
    float x_fft_buf[2][kExtendedNumPartitions * PART_LEN1],
    float e_fft[2][PART_LEN1],
    float h_fft_buf[2][kExtendedNumPartitions * PART_LEN1]) {
  int i, j;
  float fft[PART_LEN2];
  for (i = 0; i < num_partitions; i++) {
    int xPos = (i + x_fft_buf_block_pos) * (PART_LEN1);
    int pos;
    // Check for wrap
    if (i + x_fft_buf_block_pos >= num_partitions) {
      xPos -= num_partitions * PART_LEN1;
    }

    pos = i * PART_LEN1;

    for (j = 0; j < PART_LEN; j++) {
      fft[2 * j] = MulRe(x_fft_buf[0][xPos + j], -x_fft_buf[1][xPos + j],
                         e_fft[0][j], e_fft[1][j]);
      fft[2 * j + 1] = MulIm(x_fft_buf[0][xPos + j], -x_fft_buf[1][xPos + j],
                             e_fft[0][j], e_fft[1][j]);
    }
    fft[1] =
        MulRe(x_fft_buf[0][xPos + PART_LEN], -x_fft_buf[1][xPos + PART_LEN],
              e_fft[0][PART_LEN], e_fft[1][PART_LEN]);

    aec_rdft_inverse_128(fft);
    memset(fft + PART_LEN, 0, sizeof(float) * PART_LEN);

    // fft scaling
    {
      float scale = 2.0f / PART_LEN2;
      for (j = 0; j < PART_LEN; j++) {
        fft[j] *= scale;
      }
    }
    aec_rdft_forward_128(fft);

    h_fft_buf[0][pos] += fft[0];
    h_fft_buf[0][pos + PART_LEN] += fft[1];

    for (j = 1; j < PART_LEN; j++) {
      h_fft_buf[0][pos + j] += fft[2 * j];
      h_fft_buf[1][pos + j] += fft[2 * j + 1];
    }
  }
}